

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateClearFunctionDeclaration
          (OneofGenerator *this,Printer *printer)

{
  char acVar1 [8];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined1 local_28 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  vars;
  Printer *printer_local;
  OneofGenerator *this_local;
  
  vars.storage_.callback_buffer_ = (char  [8])printer;
  io::Printer::
  WithVars<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>const&,void,void>
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
              *)local_28,printer,&this->variables_);
  acVar1 = vars.storage_.callback_buffer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,
             "\n      /**\n       * Clears whatever value was set for the oneof \'$name$\'.\n       **/\n      void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);\n    "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)acVar1,local_38._M_len,local_38._M_str);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
              *)local_28);
  return;
}

Assistant:

void OneofGenerator::GenerateClearFunctionDeclaration(
    io::Printer* printer) const {
  auto vars = printer->WithVars(variables_);
  printer->Emit(R"objc(
      /**
       * Clears whatever value was set for the oneof '$name$'.
       **/
      void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);
    )objc");
}